

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

bool WriteToFile(string *path,Span<const_unsigned_char> in)

{
  bool bVar1;
  char *pcVar2;
  FILE *pFVar3;
  undefined8 uVar4;
  int *piVar5;
  uchar *__ptr;
  size_t __size;
  size_t sVar6;
  unique_ptr<_IO_FILE,_FileCloser> local_30;
  ScopedFILE file;
  string *path_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = (uchar *)in.size_;
  path_local = (string *)in.data_;
  file._M_t.super___uniq_ptr_impl<_IO_FILE,_FileCloser>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_FileCloser>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_IO_FILE,_FileCloser,_true,_true>)
                 (__uniq_ptr_data<_IO_FILE,_FileCloser,_true,_true>)path;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(pcVar2,"wb");
  std::unique_ptr<_IO_FILE,FileCloser>::unique_ptr<FileCloser,void>
            ((unique_ptr<_IO_FILE,FileCloser> *)&local_30,(pointer)pFVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  pFVar3 = _stderr;
  if (bVar1) {
    __ptr = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&path_local);
    __size = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&path_local);
    pFVar3 = (FILE *)std::unique_ptr<_IO_FILE,_FileCloser>::get(&local_30);
    sVar6 = fwrite(__ptr,__size,1,pFVar3);
    pFVar3 = _stderr;
    if (sVar6 == 1) {
      in_local.size_._7_1_ = 1;
    }
    else {
      uVar4 = std::__cxx11::string::c_str();
      piVar5 = __errno_location();
      pcVar2 = strerror(*piVar5);
      fprintf(pFVar3,"Failed to write to \'%s\': %s\n",uVar4,pcVar2);
      in_local.size_._7_1_ = 0;
    }
  }
  else {
    uVar4 = std::__cxx11::string::c_str();
    piVar5 = __errno_location();
    pcVar2 = strerror(*piVar5);
    fprintf(pFVar3,"Failed to open \'%s\': %s\n",uVar4,pcVar2);
    in_local.size_._7_1_ = 0;
  }
  std::unique_ptr<_IO_FILE,_FileCloser>::~unique_ptr(&local_30);
  return (bool)(in_local.size_._7_1_ & 1);
}

Assistant:

bool WriteToFile(const std::string &path, bssl::Span<const uint8_t> in) {
  ScopedFILE file(fopen(path.c_str(), "wb"));
  if (!file) {
    fprintf(stderr, "Failed to open '%s': %s\n", path.c_str(), strerror(errno));
    return false;
  }
  if (fwrite(in.data(), in.size(), 1, file.get()) != 1) {
    fprintf(stderr, "Failed to write to '%s': %s\n", path.c_str(),
            strerror(errno));
    return false;
  }
  return true;
}